

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_view_2d(ggml_context *ctx,ggml_tensor *a,int ne0,int ne1,size_t nb1,size_t offset)

{
  ggml_tensor *pgVar1;
  int ne [4];
  
  if (a->grad == (ggml_tensor *)0x0) {
    ne[2] = 1;
    ne[3] = 1;
    ne[0] = ne0;
    ne[1] = ne1;
    pgVar1 = ggml_new_tensor_impl(ctx,a->type,2,ne,(void *)(offset + (long)a->data));
    pgVar1->nb[1] = nb1;
    pgVar1->nb[2] = (long)ne1 * nb1;
    pgVar1->nb[3] = (long)ne1 * nb1;
    pgVar1->op = GGML_OP_VIEW;
    pgVar1->grad = (ggml_tensor *)0x0;
    pgVar1->src0 = a;
    pgVar1->src1 = (ggml_tensor *)0x0;
    return pgVar1;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf24,
          "false");
  abort();
}

Assistant:

struct ggml_tensor * ggml_view_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   ne0,
        int                   ne1,
        size_t                nb1,
        size_t                offset) {
    if (a->grad) {
        GGML_ASSERT(false); // gradient propagation is not supported
    }

    const int ne[GGML_MAX_DIMS] = { ne0, ne1, 1, 1 };

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 2, ne, (char *) a->data + offset);

    result->nb[1] = nb1;
    result->nb[2] = result->nb[1]*ne1;
    result->nb[3] = result->nb[2];

    result->op   = GGML_OP_VIEW;
    result->grad = NULL;
    result->src0 = a;
    result->src1 = NULL; // TODO: maybe store the offset here?

    return result;
}